

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O1

void __thiscall FParser::SF_PlayerAmmo(FParser *this)

{
  int amount;
  uint uVar1;
  int iVar2;
  PClassAmmo *type;
  AInventory *pAVar3;
  ulong uVar4;
  
  if (1 < this->t_argc) {
    uVar1 = T_GetPlayerNum(this->t_argv);
    if (uVar1 != 0xffffffff) {
      type = T_GetAmmo(this->t_argv + 1);
      if (type != (PClassAmmo *)0x0) {
        uVar4 = (ulong)uVar1;
        if (2 < this->t_argc) {
          pAVar3 = AActor::FindInventory
                             ((AActor *)(&players)[uVar4 * 0x54],(PClassActor *)type,false);
          iVar2 = intvalue(this->t_argv + 2);
          amount = 0;
          if (0 < iVar2) {
            amount = iVar2;
          }
          if (pAVar3 == (AInventory *)0x0) {
            AActor::GiveAmmo((AActor *)(&players)[uVar4 * 0x54],type,amount);
          }
          else {
            pAVar3->Amount = amount;
          }
        }
        (this->t_return).type = 1;
        pAVar3 = AActor::FindInventory((AActor *)(&players)[uVar4 * 0x54],(PClassActor *)type,false)
        ;
        if (pAVar3 == (AInventory *)0x0) {
          (this->t_return).value.i = 0;
        }
        else {
          (this->t_return).value.i = pAVar3->Amount;
        }
      }
    }
    return;
  }
  script_error("Insufficient parameters for \'%s\'\n",(this->t_func).Chars);
  return;
}

Assistant:

void FParser::SF_PlayerAmmo(void)
{
	int playernum, amount;
	PClassAmmo * ammotype;
	
	if (CheckArgs(2))
	{
		playernum=T_GetPlayerNum(t_argv[0]);
		if (playernum==-1) return;

		ammotype=T_GetAmmo(t_argv[1]);
		if (!ammotype) return;

		if(t_argc >= 3)
		{
			AInventory * iammo = players[playernum].mo->FindInventory(ammotype);
			amount = intvalue(t_argv[2]);
			if(amount < 0) amount = 0;
			if (iammo) iammo->Amount = amount;
			else players[playernum].mo->GiveAmmo(ammotype, amount);
		}

		t_return.type = svt_int;
		AInventory * iammo = players[playernum].mo->FindInventory(ammotype);
		if (iammo) t_return.value.i = iammo->Amount;
		else t_return.value.i = 0;
	}
}